

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineVertexUtil.cpp
# Opt level: O0

vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_> *
vkt::pipeline::createFullscreenQuad(void)

{
  Vertex4Tex4 *this;
  Vertex4Tex4 *this_00;
  Vertex4Tex4 *this_01;
  vector<vkt::pipeline::Vertex4Tex4,std::allocator<vkt::pipeline::Vertex4Tex4>> *in_RDI;
  allocator<vkt::pipeline::Vertex4Tex4> local_159;
  undefined1 local_158 [8];
  Vertex4Tex4 vertices [6];
  Vertex4Tex4 upperRightVertex;
  Vertex4Tex4 lowerRightVertex;
  Vertex4Tex4 upperLeftVertex;
  Vertex4Tex4 lowerLeftVertex;
  
  this = (Vertex4Tex4 *)(upperLeftVertex.texCoord.m_data + 2);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)this,-1.0,-1.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(lowerLeftVertex.position.m_data + 2),0.0,0.0,0.0,0.0);
  this_00 = (Vertex4Tex4 *)(lowerRightVertex.texCoord.m_data + 2);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)this_00,-1.0,1.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(upperLeftVertex.position.m_data + 2),0.0,1.0,0.0,0.0);
  this_01 = (Vertex4Tex4 *)(upperRightVertex.texCoord.m_data + 2);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)this_01,1.0,-1.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(lowerRightVertex.position.m_data + 2),1.0,0.0,0.0,0.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&stack0xffffffffffffff70,1.0,1.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(upperRightVertex.position.m_data + 2),1.0,1.0,0.0,0.0);
  Vertex4Tex4::Vertex4Tex4((Vertex4Tex4 *)local_158,this);
  Vertex4Tex4::Vertex4Tex4((Vertex4Tex4 *)(vertices[0].texCoord.m_data + 2),this_01);
  Vertex4Tex4::Vertex4Tex4((Vertex4Tex4 *)(vertices[1].texCoord.m_data + 2),this_00);
  Vertex4Tex4::Vertex4Tex4((Vertex4Tex4 *)(vertices[2].texCoord.m_data + 2),this_00);
  Vertex4Tex4::Vertex4Tex4((Vertex4Tex4 *)(vertices[3].texCoord.m_data + 2),this_01);
  Vertex4Tex4::Vertex4Tex4
            ((Vertex4Tex4 *)(vertices[4].texCoord.m_data + 2),
             (Vertex4Tex4 *)&stack0xffffffffffffff70);
  std::allocator<vkt::pipeline::Vertex4Tex4>::allocator(&local_159);
  std::vector<vkt::pipeline::Vertex4Tex4,std::allocator<vkt::pipeline::Vertex4Tex4>>::
  vector<vkt::pipeline::Vertex4Tex4_const*,void>
            (in_RDI,(Vertex4Tex4 *)local_158,(Vertex4Tex4 *)(vertices[5].texCoord.m_data + 2),
             &local_159);
  std::allocator<vkt::pipeline::Vertex4Tex4>::~allocator(&local_159);
  return (vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_> *)in_RDI;
}

Assistant:

std::vector<Vertex4Tex4> createFullscreenQuad (void)
{
	using tcu::Vec4;

	const Vertex4Tex4 lowerLeftVertex =
	{
		Vec4(-1.0f, -1.0f, 0.0f, 1.0f),
		Vec4(0.0f, 0.0f, 0.0f, 0.0f)
	};
	const Vertex4Tex4 upperLeftVertex =
	{
		Vec4(-1.0f, 1.0f, 0.0f, 1.0f),
		Vec4(0.0f, 1.0f, 0.0f, 0.0f)
	};
	const Vertex4Tex4 lowerRightVertex =
	{
		Vec4(1.0f, -1.0f, 0.0f, 1.0f),
		Vec4(1.0f, 0.0f, 0.0f, 0.0f)
	};
	const Vertex4Tex4 upperRightVertex =
	{
		Vec4(1.0f, 1.0f, 0.0f, 1.0f),
		Vec4(1.0f, 1.0f, 0.0f, 0.0f)
	};

	const Vertex4Tex4 vertices[6] =
	{
		lowerLeftVertex,
		lowerRightVertex,
		upperLeftVertex,

		upperLeftVertex,
		lowerRightVertex,
		upperRightVertex
	};

	return std::vector<Vertex4Tex4>(vertices, vertices + DE_LENGTH_OF_ARRAY(vertices));
}